

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O3

void testReadTiles(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  undefined8 extraout_RAX;
  ostream *in_RCX;
  char *pcVar4;
  char *pcVar5;
  char *unaff_R12;
  char *pcVar6;
  ostream *unaff_R15;
  exr_context_t f;
  int levelsy;
  int levelsx;
  int32_t ccount;
  exr_storage_t ps;
  uint64_t pchunksz;
  string fn;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  undefined8 local_310;
  int local_308;
  int local_304;
  undefined1 local_300 [4];
  int local_2fc;
  long local_2f8;
  long *local_2f0 [2];
  long local_2e0 [2];
  ostream local_2d0 [22];
  char local_2ba;
  char local_2b9;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  undefined8 local_290;
  code *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  ostream local_228 [8];
  undefined8 *local_220;
  short local_218;
  long local_1b0;
  long local_1a0;
  
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2f0,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,"");
  local_240 = 0;
  local_250 = 0;
  uStack_248 = 0;
  local_260 = 0;
  uStack_258 = 0;
  local_270 = 0;
  uStack_268 = 0;
  local_280 = 0;
  uStack_278 = 0;
  local_230 = 0;
  local_290 = 0x68;
  uStack_238 = 0xbf800000fffffffe;
  local_288 = err_cb;
  std::__cxx11::string::append((char *)local_2f0);
  iVar1 = exr_start_read(&local_310,local_2f0[0],&local_290);
  if (iVar1 == 0) {
    iVar1 = exr_get_storage(local_310,0,&local_2fc);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00148a50;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00148a66;
    }
    if (local_2fc != 1) {
      core_test_fail("EXR_STORAGE_TILED == ps",(char *)0x196,0x34bba9,(char *)in_RCX);
      iVar1 = 0;
LAB_0014791b:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00148aa5;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00148abb;
    }
    iVar1 = exr_get_chunk_count(0,0,local_300);
    if (iVar1 != 2) goto LAB_0014791b;
    iVar1 = exr_get_chunk_count(local_310,0xffffffff,local_300);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149a4a;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149a60;
    }
    iVar1 = exr_get_chunk_count(local_310,0xb,local_300);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149a9f;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149ab5;
    }
    iVar1 = exr_get_chunk_count(local_310,0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149af4;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149b0a;
    }
    iVar1 = exr_get_chunk_count(local_310,0,local_300);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_chunk_count (f, 0, &ccount)",(char *)0x1a1,0x34bba9,(char *)in_RCX);
LAB_00148d02:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00148d18:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(0x12);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149b49;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149b5f;
    }
    iVar1 = exr_get_scanlines_per_chunk(local_310,0,local_300);
    if (iVar1 != 0x12) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00148d02;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00148d18;
    }
    local_304 = -1;
    in_RCX = (ostream *)&local_308;
    local_308 = -1;
    iVar1 = exr_get_tile_levels(0,0);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(2);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149b9e;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149bb4;
    }
    iVar1 = 2;
    if (local_304 != -1) {
      pcVar4 = (char *)0x1aa;
      pcVar6 = "levelsx == -1";
LAB_00148226:
      core_test_fail(pcVar6,pcVar4,0x34bba9,(char *)in_RCX);
LAB_00148235:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
LAB_00149365:
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(0x12);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149df1;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149e07;
    }
    pcVar6 = "levelsy == -1";
    if (local_308 != -1) {
      pcVar4 = (char *)0x1ab;
      goto LAB_00148226;
    }
    in_RCX = (ostream *)&local_308;
    iVar1 = exr_get_tile_levels(local_310,1,&local_304);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149bf3;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149c09;
    }
    iVar1 = 4;
    if (local_304 != -1) {
      pcVar4 = (char *)0x1b0;
      pcVar6 = "levelsx == -1";
      goto LAB_00148226;
    }
    if (local_308 != -1) {
      pcVar4 = (char *)0x1b1;
      goto LAB_00148226;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_levels(local_310,0,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, __null, __null)",(char *)0x1b3,0x34bba9,
                     (char *)in_RCX);
LAB_00148edd:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00148ef3:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, &levelsx, __null)",(char *)0x1b6,0x34bba9,
                     (char *)in_RCX);
LAB_00148f32:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00148f48:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, __null, &levelsy)",(char *)0x1ba,0x34bba9,
                     (char *)in_RCX);
LAB_00148f87:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00148f9d:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, &levelsx, &levelsy)",(char *)0x1be,0x34bba9,
                     (char *)in_RCX);
LAB_00148fdc:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00148ff2:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(2);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149c48;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149c5e;
    }
    local_304 = -1;
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_levels(local_310,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00148edd;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00148ef3;
    }
    if (local_304 != 1) {
      pcVar4 = (char *)0x1b7;
      iVar1 = 0;
      pcVar6 = "levelsx == 1";
      goto LAB_00148226;
    }
    in_RCX = (ostream *)&local_308;
    local_308 = -1;
    iVar1 = exr_get_tile_levels(local_310,0,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00148f32;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00148f48;
    }
    pcVar6 = "levelsy == 1";
    if (local_308 != 1) {
      pcVar4 = (char *)0x1bb;
      iVar1 = 0;
      goto LAB_00148226;
    }
    in_RCX = (ostream *)&local_308;
    local_308 = -1;
    local_304 = -1;
    iVar1 = exr_get_tile_levels(local_310,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00148f87;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00148f9d;
    }
    iVar1 = 0;
    if (local_304 != 1) {
      pcVar4 = (char *)0x1bf;
      pcVar6 = "levelsx == 1";
      goto LAB_00148226;
    }
    if (local_308 != 1) {
      pcVar4 = (char *)0x1c0;
      goto LAB_00148226;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(0,0,0,0,0,0);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00148fdc;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00148ff2;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_310,0,0xffffffff,0,&local_304,&local_308);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149c9d;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149cb3;
    }
    in_RCX = (ostream *)0xffffffff;
    iVar1 = exr_get_tile_sizes(local_310,0,0,0xffffffff,&local_304,&local_308);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149cf2;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149d08;
    }
    in_RCX = (ostream *)0x64;
    iVar1 = exr_get_tile_sizes(local_310,0,0,100,&local_304,&local_308);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149d47;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149d5d;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_310,0,100,0,&local_304,&local_308);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149d9c;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149db2;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_310,0,0,0,&local_304,&local_308);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &levelsx, &levelsy)",(char *)0x1d1,0x34bba9,
                     (char *)in_RCX);
LAB_001492bb:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_001492d1:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &levelsx, __null)",(char *)0x1d5,0x34bba9,
                     (char *)in_RCX);
LAB_00149310:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149326:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, __null, &levelsy)",(char *)0x1d8,0x34bba9,
                     (char *)in_RCX);
      goto LAB_00149365;
    }
    iVar1 = 0;
    if (local_304 != 0xc) {
      pcVar4 = (char *)0x1d2;
      pcVar6 = "levelsx == 12";
      goto LAB_00148226;
    }
    pcVar6 = "levelsy == 24";
    if (local_308 != 0x18) {
      pcVar4 = (char *)0x1d3;
      goto LAB_00148226;
    }
    local_304 = -1;
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_310,0,0,0,&local_304,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_001492bb;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001492d1;
    }
    if (local_304 != 0xc) {
      pcVar4 = (char *)0x1d6;
      iVar1 = 0;
      pcVar6 = "levelsx == 12";
      goto LAB_00148226;
    }
    local_308 = -1;
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_310,0,0,0,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00149310;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149326;
    }
    if (local_308 != 0x18) {
      pcVar4 = (char *)0x1d9;
      iVar1 = 0;
      goto LAB_00148226;
    }
    poVar2 = local_2d0;
    in_RCX = poVar2;
    iVar1 = exr_read_scanline_chunk_info(local_310,0,0x2a);
    if (iVar1 != 0x12) goto LAB_00148235;
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(0,0,4,2,0,0,poVar2);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(2);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149e46;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149e5c;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_310,0xffffffff,4,2,0,0,poVar2);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149e9b;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149eb1;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_310,1,4,2,0,0,poVar2);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149ef0;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149f06;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_310,0,4,2,0,0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149f45;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149f5b;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_310,0,4,2,0,0xffffffff,poVar2);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149f9a;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00149fb0;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_310,0,4,2,0xffffffff,0,poVar2);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00149fef;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014a005;
    }
    in_RCX = (ostream *)0xfffffffe;
    iVar1 = exr_read_tile_chunk_info(local_310,0,4,0xfffffffe,0,0,poVar2);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_0014a044;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014a05a;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_310,0,0xfffffffc,2,0,0,poVar2);
    if (iVar1 == 3) {
      in_RCX = (ostream *)0x2;
      iVar1 = exr_read_tile_chunk_info(local_310,0,4,2,0,0,poVar2);
      if (iVar1 == 0) {
        local_2f8 = 0;
        iVar1 = exr_get_chunk_unpacked_size(local_310,0);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(iVar1);
          if ((float *)pcVar6 != (float *)0x0) goto LAB_0014984c;
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          goto LAB_00149862;
        }
        if (local_2ba != '\x01') {
          pcVar6 = (char *)0x1fd;
          pcVar4 = "cinfo.type == EXR_STORAGE_TILED";
LAB_00148741:
          core_test_fail(pcVar4,pcVar6,0x34bba9,(char *)in_RCX);
          iVar1 = 0;
LAB_0014874d:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(iVar1);
          if ((float *)pcVar6 != (float *)0x0) goto LAB_001498a1;
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          goto LAB_001498b7;
        }
        if (local_2b9 != '\0') {
          pcVar6 = (char *)0x1fe;
          pcVar4 = "cinfo.compression == EXR_COMPRESSION_NONE";
          goto LAB_00148741;
        }
        if (local_2b0 != local_2f8) {
          pcVar6 = (char *)0x1ff;
          pcVar4 = "cinfo.packed_size == pchunksz";
          goto LAB_00148741;
        }
        if (local_2a8 != local_2b0) {
          pcVar6 = (char *)0x200;
          pcVar4 = "cinfo.unpacked_size == pchunksz";
          goto LAB_00148741;
        }
        if (local_2a0 != 0) {
          pcVar6 = (char *)0x201;
          pcVar4 = "cinfo.sample_count_data_offset == 0";
          goto LAB_00148741;
        }
        if (local_298 != 0) {
          pcVar6 = (char *)0x202;
          pcVar4 = "cinfo.sample_count_table_size == 0";
          goto LAB_00148741;
        }
        in_RCX = local_228;
        iVar1 = exr_decoding_initialize(local_310,0,local_2d0);
        if (iVar1 != 0) goto LAB_0014874d;
        if (local_218 != 2) {
          pcVar4 = (char *)0x207;
          pcVar5 = "decoder.channel_count == 2";
LAB_00148856:
          core_test_fail(pcVar5,pcVar4,0x34bba9,(char *)in_RCX);
          iVar1 = 0;
LAB_00148862:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar1);
          if (unaff_R12 != (char *)0x0) goto LAB_001498f6;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_0014990c;
        }
        pcVar4 = (char *)0x208;
        pcVar5 = "!strcmp (decoder.channels[0].channel_name, \"G\")";
        if ((*(char *)*local_220 != 'G') || (((char *)*local_220)[1] != '\0')) goto LAB_00148856;
        if (*(char *)((long)local_220 + 0x19) != '\x02') {
          pcVar4 = (char *)0x209;
          pcVar5 = "decoder.channels[0].bytes_per_element == 2";
          goto LAB_00148856;
        }
        if (*(int *)((long)local_220 + 0xc) != 0xc) {
          pcVar4 = (char *)0x20a;
          pcVar5 = "decoder.channels[0].width == 12";
          goto LAB_00148856;
        }
        if (*(int *)(local_220 + 1) != 0x18) {
          pcVar4 = (char *)0x20b;
          pcVar5 = "decoder.channels[0].height == 24";
          goto LAB_00148856;
        }
        if (*(int *)(local_220 + 2) != 1) {
          pcVar4 = (char *)0x20c;
          pcVar5 = "decoder.channels[0].x_samples == 1";
          goto LAB_00148856;
        }
        if (*(int *)((long)local_220 + 0x14) != 1) {
          pcVar4 = (char *)0x20d;
          pcVar5 = "decoder.channels[0].y_samples == 1";
          goto LAB_00148856;
        }
        pcVar4 = (char *)0x20e;
        pcVar5 = "!strcmp (decoder.channels[1].channel_name, \"Z\")";
        if ((*(char *)local_220[6] != 'Z') || (((char *)local_220[6])[1] != '\0'))
        goto LAB_00148856;
        if (*(char *)((long)local_220 + 0x49) != '\x04') {
          pcVar4 = (char *)0x20f;
          pcVar5 = "decoder.channels[1].bytes_per_element == 4";
          goto LAB_00148856;
        }
        if (*(int *)((long)local_220 + 0x3c) != 0xc) {
          pcVar4 = (char *)0x210;
          pcVar5 = "decoder.channels[1].width == 12";
          goto LAB_00148856;
        }
        if (*(int *)(local_220 + 7) != 0x18) {
          pcVar4 = (char *)0x211;
          pcVar5 = "decoder.channels[1].height == 24";
          goto LAB_00148856;
        }
        if (*(int *)(local_220 + 8) != 1) {
          pcVar4 = (char *)0x212;
          pcVar5 = "decoder.channels[1].x_samples == 1";
          goto LAB_00148856;
        }
        if (*(int *)((long)local_220 + 0x44) != 1) {
          pcVar4 = (char *)0x213;
          pcVar5 = "decoder.channels[1].y_samples == 1";
          goto LAB_00148856;
        }
        poVar2 = (ostream *)operator_new__(0x240);
        pcVar6 = (char *)operator_new__(0x480);
        memset(poVar2,0,0x240);
        memset(pcVar6,0,0x480);
        local_220[5] = poVar2;
        local_220[4] = 0x1800000002;
        *(undefined2 *)((long)local_220 + 0x1c) = 2;
        local_220[0xb] = pcVar6;
        local_220[10] = 0x3000000004;
        *(undefined2 *)((long)local_220 + 0x4c) = 4;
        iVar1 = exr_decoding_choose_default_routines(local_310,0,local_228);
        if (iVar1 != 0) goto LAB_00148862;
        iVar1 = exr_decoding_run(local_310,0,local_228);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar1);
          if (unaff_R12 != (char *)0x0) goto LAB_0014994b;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_00149961;
        }
        if (local_1b0 == 0) {
          if (local_1a0 != 0) {
            pcVar4 = (char *)0x229;
            pcVar5 = "decoder.unpacked_buffer == __null";
            goto LAB_0014895a;
          }
          if (*(short *)poVar2 != 0x33d5) goto LAB_00148966;
          if (1e-06 <= ABS(*(float *)pcVar6 + -0.244778)) {
            pcVar4 = (char *)0x22e;
            pcVar5 = "fabsf (*curz - 0.244778f) < 0.000001f";
            goto LAB_00148980;
          }
          iVar1 = exr_decoding_destroy(local_310,local_228);
          if (iVar1 == 0) {
            exr_finish(&local_310);
            operator_delete__(pcVar6);
            operator_delete__(poVar2);
            if (local_2f0[0] != local_2e0) {
              operator_delete(local_2f0[0],local_2e0[0] + 1);
            }
            return;
          }
        }
        else {
          pcVar4 = (char *)0x227;
          pcVar5 = "decoder.packed_buffer == __null";
LAB_0014895a:
          core_test_fail(pcVar5,pcVar4,0x34bba9,(char *)in_RCX);
LAB_00148966:
          pcVar4 = (char *)0x22d;
          pcVar5 = "*curg == 0x33d5";
LAB_00148980:
          core_test_fail(pcVar5,pcVar4,0x34bba9,(char *)in_RCX);
          iVar1 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
        unaff_R12 = (char *)exr_get_default_error_message(iVar1);
        if (unaff_R12 != (char *)0x0) goto LAB_001499a0;
        std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(iVar1);
        if ((float *)pcVar6 == (float *)0x0) {
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
        }
        else {
          sVar3 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo)",(char *)0x1fa,0x34bba9,
                       (char *)in_RCX);
LAB_0014984c:
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149862:
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_get_chunk_unpacked_size (f, 0, &pchunksz)",(char *)0x1fc,0x34bba9,
                       (char *)in_RCX);
LAB_001498a1:
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_001498b7:
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x205,0x34bba9,
                       (char *)in_RCX);
LAB_001498f6:
        sVar3 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar3);
LAB_0014990c:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x222,
                       0x34bba9,(char *)in_RCX);
LAB_0014994b:
        sVar3 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar3);
LAB_00149961:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x224,0x34bba9,(char *)in_RCX);
LAB_001499a0:
        sVar3 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
      std::ostream::put((char)unaff_R15);
      std::ostream::flush();
      core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x236,0x34bba9,(char *)in_RCX);
      goto LAB_001499f5;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if ((float *)pcVar6 == (float *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014a0af;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x192,0x34bba9,(char *)in_RCX)
    ;
LAB_00148a50:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00148a66:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_storage (f, 0, &ps)",(char *)0x195,0x34bba9,(char *)in_RCX);
LAB_00148aa5:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00148abb:
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(2);
    if ((float *)pcVar6 == (float *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
LAB_001499f5:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (__null, 0, &ccount)",(char *)0x19a,0x34bba9,(char *)in_RCX)
    ;
LAB_00149a4a:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149a60:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, -1, &ccount)",(char *)0x19c,0x34bba9,(char *)in_RCX);
LAB_00149a9f:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149ab5:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, 11, &ccount)",(char *)0x19e,0x34bba9,(char *)in_RCX);
LAB_00149af4:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149b0a:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, 0, __null)",(char *)0x1a0,0x34bba9,(char *)in_RCX);
LAB_00149b49:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149b5f:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_scanlines_per_chunk (f, 0, &ccount)",(char *)0x1a4,0x34bba9,
                   (char *)in_RCX);
LAB_00149b9e:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149bb4:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_levels (__null, 0, &levelsx, &levelsy)",(char *)0x1a9,0x34bba9,
                   (char *)in_RCX);
LAB_00149bf3:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149c09:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_levels (f, 1, &levelsx, &levelsy)",(char *)0x1af,0x34bba9,
                   (char *)in_RCX);
LAB_00149c48:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149c5e:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (__null, 0, 0, 0, __null, __null)",(char *)0x1c4,0x34bba9,
                   (char *)in_RCX);
LAB_00149c9d:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149cb3:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (f, 0, -1, 0, &levelsx, &levelsy)",(char *)0x1c7,0x34bba9,
                   (char *)in_RCX);
LAB_00149cf2:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149d08:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (f, 0, 0, -1, &levelsx, &levelsy)",(char *)0x1ca,0x34bba9,
                   (char *)in_RCX);
LAB_00149d47:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149d5d:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (f, 0, 0, 100, &levelsx, &levelsy)",(char *)0x1cd,0x34bba9,
                   (char *)in_RCX);
LAB_00149d9c:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149db2:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (f, 0, 100, 0, &levelsx, &levelsy)",(char *)0x1d0,0x34bba9,
                   (char *)in_RCX);
LAB_00149df1:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149e07:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (f, 0, 42, &cinfo)",(char *)0x1de,0x34bba9,
                   (char *)in_RCX);
LAB_00149e46:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149e5c:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (__null, 0, 4, 2, 0, 0, &cinfo)",(char *)0x1e2,0x34bba9
                   ,(char *)in_RCX);
LAB_00149e9b:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149eb1:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, -1, 4, 2, 0, 0, &cinfo)",(char *)0x1e5,0x34bba9,
                   (char *)in_RCX);
LAB_00149ef0:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149f06:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 1, 4, 2, 0, 0, &cinfo)",(char *)0x1e8,0x34bba9,
                   (char *)in_RCX);
LAB_00149f45:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149f5b:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, __null)",(char *)0x1eb,0x34bba9,
                   (char *)in_RCX);
LAB_00149f9a:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00149fb0:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, -1, &cinfo)",(char *)0x1ee,0x34bba9,
                   (char *)in_RCX);
LAB_00149fef:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014a005:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, -1, 0, &cinfo)",(char *)0x1f1,0x34bba9,
                   (char *)in_RCX);
LAB_0014a044:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014a05a:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, -2, 0, 0, &cinfo)",(char *)0x1f4,0x34bba9,
                   (char *)in_RCX);
  }
  sVar3 = strlen(pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014a0af:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  core_test_fail("exr_read_tile_chunk_info (f, 0, -4, 2, 0, 0, &cinfo)",(char *)0x1f7,0x34bba9,
                 (char *)in_RCX);
  operator_delete__(poVar2);
  if (local_2f0[0] != local_2e0) {
    operator_delete(local_2f0[0],local_2e0[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testOpenScans (const std::string& tempdir)
{
    exr_context_t f;
    std::string   fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.1.exr";

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.planar.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.interleaved.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}